

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolledFile.cpp
# Opt level: O0

bool PolledFile::Impl::readFileContents
               (char *filename,vector<unsigned_char,_std::allocator<unsigned_char>_> *out_buffer)

{
  int __fd;
  uint *puVar1;
  uchar *__buf;
  __dev_t _Var2;
  undefined1 local_d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  undefined1 local_b8 [4];
  int result;
  stat st;
  int fd;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_buffer_local;
  char *filename_local;
  
  st.__glibc_reserved[2]._4_4_ = open(filename,0);
  if (st.__glibc_reserved[2]._4_4_ < 0) {
    aAppDebugPrintf("Cannot open file %s",filename);
    filename_local._7_1_ = false;
  }
  else {
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = stat(filename,(stat *)local_b8);
    if (buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,st.st_rdev);
      __fd = st.__glibc_reserved[2]._4_4_;
      __buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
      _Var2 = read(__fd,__buf,st.st_rdev);
      if (_Var2 != st.st_rdev) {
        aAppDebugPrintf("Cannot read %d bytes from file \'%s\'",st.st_rdev & 0xffffffff,filename);
        st.st_rdev = 0;
      }
      close(st.__glibc_reserved[2]._4_4_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                (out_buffer,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
      filename_local._7_1_ = st.st_rdev != 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
    }
    else {
      puVar1 = (uint *)__errno_location();
      aAppDebugPrintf("Cannot read %s stat: errno=%d",filename,(ulong)*puVar1);
      filename_local._7_1_ = false;
    }
  }
  return filename_local._7_1_;
}

Assistant:

static bool readFileContents(const char *filename, std::vector<unsigned char>& out_buffer) {
#ifdef _WIN32
		const HANDLE fh = CreateFileA(filename, GENERIC_READ, FILE_SHARE_READ, NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
		if (fh == INVALID_HANDLE_VALUE) {
			MSG("Cannot open file '%s'", filename);
			return false;
		}

		LARGE_INTEGER splurge_integer;
		if (!GetFileSizeEx(fh, &splurge_integer) || splurge_integer.QuadPart > 1024 * 1024) {
			MSG("Cannot get file '%s' size or size is too large", filename);
			return false;
		}

		const size_t size = splurge_integer.QuadPart;
		std::vector<unsigned char> buffer;
		buffer.resize(size);
		DWORD bytes_read = 0;
		if (!ReadFile(fh, buffer.data(), size, &bytes_read, NULL) || bytes_read != size) {
			MSG("Cannot read %d bytes from file '%s'", size, filename);
			bytes_read = 0;
		}

		CloseHandle(fh);
		out_buffer.swap(buffer);
		return bytes_read != 0;
#else
		const int fd = open(filename, O_RDONLY);
		if (fd < 0) {
			MSG("Cannot open file %s", filename);
			return false;
		}

		struct stat st;
		const int result = stat(filename, &st);
		if (result != 0) {
			MSG("Cannot read %s stat: errno=%d", filename, errno);
			return false;
		}

		std::vector<unsigned char> buffer;
		buffer.resize(st.st_size);
		if (read(fd, buffer.data(), st.st_size) != st.st_size) {
			MSG("Cannot read %d bytes from file '%s'", (int)st.st_size, filename);
			st.st_size = 0;
		}

		close(fd);
		out_buffer.swap(buffer);
		return st.st_size != 0;
#endif
	}